

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O0

bool __thiscall cmValue::IsNOTFOUND(cmValue *this,string_view value)

{
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view suffix;
  bool local_89;
  string_view value_local;
  
  __y = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("NOTFOUND",8);
  __x._M_str = (char *)value._M_len;
  __x._M_len = (size_t)this;
  bVar1 = std::operator==(__x,__y);
  local_89 = true;
  if (!bVar1) {
    suffix = (string_view)cm::operator____s("-NOTFOUND",9);
    str._M_str = (char *)value._M_len;
    str._M_len = (size_t)this;
    local_89 = cmHasSuffix(str,suffix);
  }
  return local_89;
}

Assistant:

bool cmValue::IsNOTFOUND(cm::string_view value) noexcept
{
  return (value == "NOTFOUND"_s) || cmHasSuffix(value, "-NOTFOUND"_s);
}